

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
md::AddressInRegister::getAdditionnalData
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          AddressInRegister *this)

{
  uint local_30 [4];
  uint local_20;
  undefined1 local_19;
  AddressInRegister *local_18;
  AddressInRegister *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *offset_bytes;
  
  local_18 = this;
  this_local = (AddressInRegister *)__return_storage_ptr__;
  if (this->_offset == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  }
  else {
    local_19 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
    local_20 = (uint)*(byte *)((long)&this->_offset + 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)&local_20);
    local_30[0] = (uint)(byte)this->_offset;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
              (__return_storage_ptr__,(int *)local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<uint8_t> getAdditionnalData() const override
    {
        if (_offset > 0)
        {
            std::vector<uint8_t> offset_bytes;
            offset_bytes.emplace_back((_offset >> 8) & 0xFF);
            offset_bytes.emplace_back(_offset & 0xFF);
            return offset_bytes;
        }
        else return {};
    }